

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int enc_worker_hook(void *arg1,void *unused)

{
  int iVar1;
  int iVar2;
  AV1_COMP *cpi;
  long lVar3;
  ThreadData_conflict *td;
  int iVar4;
  PC_TREE *pPVar5;
  FRAME_CONTEXT *pFVar6;
  int iVar7;
  
  cpi = *arg1;
  lVar3 = *(long *)((long)arg1 + 8);
  iVar1 = (cpi->common).tiles.cols;
  iVar2 = (cpi->common).tiles.rows;
  *(long *)(lVar3 + 0x2b90) = (long)arg1 + 0x18;
  iVar4 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  iVar7 = 0;
  if (iVar4 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
      *(undefined8 *)(*(long *)((long)arg1 + 8) + 0x26e50) = 0;
    }
    else {
      pPVar5 = av1_alloc_pc_tree_node(((cpi->common).seq_params)->sb_size);
      *(PC_TREE **)(*(long *)((long)arg1 + 8) + 0x26e50) = pPVar5;
      if (pPVar5 == (PC_TREE *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)(lVar3 + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
    }
    for (iVar7 = *(int *)((long)arg1 + 0x1c8); iVar7 < iVar2 * iVar1;
        iVar7 = iVar7 + (cpi->mt_info).num_workers) {
      pFVar6 = &cpi->tile_data[(cpi->common).tiles.cols * (iVar7 / iVar1) + iVar7 % iVar1].tctx;
      td = *(ThreadData_conflict **)((long)arg1 + 8);
      (td->mb).e_mbd.tile_ctx = pFVar6;
      (td->mb).tile_pb_ctx = pFVar6;
      av1_encode_tile(cpi,td,iVar7 / iVar1,iVar7 % iVar1);
    }
    av1_free_pc_tree_recursive
              (*(PC_TREE **)(*(long *)((long)arg1 + 8) + 0x26e50),
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,0,0,
               (cpi->sf).part_sf.partition_search_type);
    *(undefined8 *)(*(long *)((long)arg1 + 8) + 0x26e50) = 0;
    iVar7 = 1;
  }
  *(undefined4 *)((long)arg1 + 0xe8) = 0;
  return iVar7;
}

Assistant:

static int enc_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  const AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int t;

  (void)unused;

  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
    return 0;
  }
  error_info->setjmp = 1;

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  for (t = thread_data->start; t < tile_rows * tile_cols;
       t += cpi->mt_info.num_workers) {
    int tile_row = t / tile_cols;
    int tile_col = t % tile_cols;

    TileDataEnc *const this_tile =
        &cpi->tile_data[tile_row * cm->tiles.cols + tile_col];
    thread_data->td->mb.e_mbd.tile_ctx = &this_tile->tctx;
    thread_data->td->mb.tile_pb_ctx = &this_tile->tctx;
    av1_encode_tile(cpi, thread_data->td, tile_row, tile_col);
  }

  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}